

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[108]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char (*args_1) [108])

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_160;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_140 [40];
  string local_118 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_f8;
  function<void()> local_e0 [32];
  tuple<char_data_*&,_const_char_(&)[108]> tuple;
  anon_class_128_3_3bdf3dc2 local_b0;
  
  nTimer_local = nTimer;
  local_160 = func;
  if (nTimer < 0) {
    local_140._0_8_ = 2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_140);
  }
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[108]>.
  super__Tuple_impl<1UL,_const_char_(&)[108]>.super__Head_base<1UL,_const_char_(&)[108],_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_(&)[108],_false>)
                 (_Head_base<1UL,_const_char_(&)[108],_false>)args_1;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[108]>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_const(&)[108]>(&chs,this,&tuple);
  local_140._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_140 + 8),(string *)from);
  std::__cxx11::string::string(local_118,(string *)funcName);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_f8,&chs);
  local_b0.func = local_160;
  local_b0.args = *args;
  memcpy(&local_b0.field_0x10,args_1,0x6c);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[108]>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[108])::_lambda()_1_,void>
            (local_e0,&local_b0);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_140);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_140);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,funcName,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}